

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_concave_shell(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  EXIT_DATA *pEVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  char *txt;
  allocator<char> local_6a;
  allocator<char> local_69;
  CHAR_DATA *ch_local;
  int *local_60;
  string local_58;
  string local_38;
  
  ch_local = ch;
  bVar2 = str_cmp(target_name,"n");
  lVar4 = 0;
  if (bVar2) {
    bVar2 = str_cmp(target_name,"north");
    if (bVar2) {
      bVar2 = str_cmp(target_name,"e");
      lVar4 = 1;
      if (bVar2) {
        bVar2 = str_cmp(target_name,"east");
        if (bVar2) {
          bVar2 = str_cmp(target_name,"s");
          lVar4 = 2;
          if (bVar2) {
            bVar2 = str_cmp(target_name,"south");
            if (bVar2) {
              lVar4 = 3;
              bVar2 = str_cmp(target_name,"w");
              if (bVar2) {
                bVar2 = str_cmp(target_name,"west");
                if (bVar2) {
                  bVar2 = str_cmp(target_name,"u");
                  lVar4 = 4;
                  if (bVar2) {
                    bVar2 = str_cmp(target_name,"up");
                    if (bVar2) {
                      bVar2 = str_cmp(target_name,"d");
                      lVar4 = 5;
                      if (bVar2) {
                        bVar2 = str_cmp(target_name,"down");
                        if (bVar2) {
                          txt = "In which direction?\n\r";
                          goto LAB_0035fa9d;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pEVar1 = ch->in_room->exit[lVar4];
  if ((pEVar1 != (EXIT_DATA *)0x0) && ((pEVar1->u1).to_room != (ROOM_INDEX_DATA *)0x0)) {
    uVar3 = (uint)pEVar1->exit_info[0];
    if ((pEVar1->exit_info[0] & 2U) != 0) {
      bVar2 = is_affected_by(ch,0x14);
      if (!bVar2) goto LAB_0035fa96;
      uVar3 = (uint)pEVar1->exit_info[0];
    }
    if ((~uVar3 & 0x12) != 0) {
      ch->disrupted = false;
      local_60 = (int *)talloc_struct(4);
      *local_60 = (int)lVar4;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"spell_concave_shell",&local_69);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"concave_shell_move",&local_6a);
      CQueue::
      AddToQueue<void(*)(char_data*,int*,room_index_data*),char_data*&,int*&,room_index_data*&>
                (&RS.Queue,6,&local_38,&local_58,concave_shell_move,&ch_local,&local_60,&ch->in_room
                );
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
      act("Air begins to swirl rapidly around you.",ch_local,(void *)0x0,(void *)0x0,3);
      act("Swirling winds begin to mass near $n.",ch_local,(void *)0x0,(void *)0x0,0);
      return;
    }
  }
LAB_0035fa96:
  txt = "That direction is obstructed!\n\r";
LAB_0035fa9d:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_concave_shell(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	EXIT_DATA *pexit;
	int dir;
	int *dirptr = nullptr;

	if (!str_cmp(target_name, "n") || !str_cmp(target_name, "north"))
	{
		dir = Directions::North;
	}
	else if (!str_cmp(target_name, "e") || !str_cmp(target_name, "east"))
	{
		dir = Directions::East;
	}
	else if (!str_cmp(target_name, "s") || !str_cmp(target_name, "south"))
	{
		dir = Directions::South;
	}
	else if (!str_cmp(target_name, "w") || !str_cmp(target_name, "west"))
	{
		dir = Directions::West;
	}
	else if (!str_cmp(target_name, "u") || !str_cmp(target_name, "up"))
	{
		dir = Directions::Up;
	}
	else if (!str_cmp(target_name, "d") || !str_cmp(target_name, "down"))
	{
		dir = Directions::Down;
	}
	else
	{
		send_to_char("In which direction?\n\r", ch);
		return;
	}

	pexit = ch->in_room->exit[dir];

	if (pexit == nullptr
		|| pexit->u1.to_room == nullptr
		|| (IS_SET(pexit->exit_info, EX_CLOSED) && !is_affected_by(ch, AFF_PASS_DOOR))
		|| (IS_SET(pexit->exit_info, EX_CLOSED) && IS_SET(pexit->exit_info, EX_NOPASS)))
	{
		send_to_char("That direction is obstructed!\n\r", ch);
		return;
	}

	ch->disrupted = false;

	dirptr = (int *)talloc_struct(sizeof(int));
	*dirptr = dir;

	RS.Queue.AddToQueue(6, "spell_concave_shell", "concave_shell_move", concave_shell_move, ch, dirptr, ch->in_room);

	act("Air begins to swirl rapidly around you.", ch, 0, 0, TO_CHAR);
	act("Swirling winds begin to mass near $n.", ch, 0, 0, TO_ROOM);
}